

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O0

void avro::
     codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>_>
     ::decode(Decoder *d,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
             *s)

{
  long *in_RDI;
  Nested t;
  string k;
  size_t i;
  size_t n;
  Nested *in_stack_ffffffffffffff68;
  mapped_type *in_stack_ffffffffffffff70;
  key_type *in_stack_ffffffffffffffa8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
  *in_stack_ffffffffffffffb0;
  string local_40 [32];
  ulong local_20;
  ulong local_18;
  long *local_8;
  
  local_8 = in_RDI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
           *)0x2c9664);
  local_18 = (**(code **)(*local_8 + 0x98))();
  while (local_18 != 0) {
    for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
      std::__cxx11::string::string(local_40);
      decode<std::__cxx11::string>
                ((Decoder *)in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->inval2);
      testgen_r::Nested::Nested(in_stack_ffffffffffffff70);
      decode<testgen_r::Nested>((Decoder *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff70 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>
           ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      testgen_r::Nested::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      testgen_r::Nested::~Nested((Nested *)0x2c971f);
      std::__cxx11::string::~string(local_40);
    }
    local_18 = (**(code **)(*local_8 + 0xa0))();
  }
  return;
}

Assistant:

static void decode(Decoder& d, std::map<std::string, T>& s) {
        s.clear();
        for (size_t n = d.mapStart(); n != 0; n = d.mapNext()) {
            for (size_t i = 0; i < n; ++i) {
                std::string k;
                avro::decode(d, k);
                T t;
                avro::decode(d, t);
                s[k] = t;
            }
        }
    }